

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O3

void * lzham::lzham_malloc(size_t size,size_t *pActual_size)

{
  void *pvVar1;
  ulong uVar2;
  char *pExp;
  ulong uVar3;
  size_t actual_size;
  ulong local_20;
  
  uVar2 = size + 3 & 0xfffffffffffffffc;
  uVar3 = 4;
  if (uVar2 != 0) {
    uVar3 = uVar2;
  }
  if (uVar3 < 0x400000001) {
    local_20 = uVar3;
    pvVar1 = (void *)(*(code *)g_pRealloc)(0,uVar3,&local_20,1,g_pUser_data);
    if (pActual_size != (size_t *)0x0) {
      *pActual_size = local_20;
    }
    if (uVar3 <= local_20 && pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    pExp = "lzham_malloc: out of memory";
  }
  else {
    pExp = "lzham_malloc: size too big";
  }
  lzham_assert(pExp,
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_mem.cpp"
               ,0x86);
  return (void *)0x0;
}

Assistant:

void* lzham_malloc(size_t size, size_t* pActual_size)
   {
      size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
      if (!size)
         size = sizeof(uint32);

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error("lzham_malloc: size too big");
         return NULL;
      }

      size_t actual_size = size;
      uint8* p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));

      if (pActual_size)
         *pActual_size = actual_size;

      if ((!p_new) || (actual_size < size))
      {
         lzham_mem_error("lzham_malloc: out of memory");
         return NULL;
      }

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      update_total_allocated(1, static_cast<mem_stat_t>(actual_size));
#endif

      return p_new;
   }